

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frm_driver.c
# Opt level: O0

int FE_Delete_Word(FORM *form)

{
  WINDOW_conflict *pWVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  char *s;
  char *cp;
  char *ep;
  char *bp;
  FIELD *field;
  FORM *form_local;
  
  pcVar3 = form->current->buf + form->currow * form->current->dcols;
  iVar2 = (int)pcVar3 + form->current->dcols;
  pcVar4 = pcVar3 + form->curcol;
  Synchronize_Buffer(form);
  if (*pcVar4 == ' ') {
    form_local._4_4_ = -0xc;
  }
  else {
    pcVar3 = After_Last_Whitespace_Character(pcVar3,form->curcol);
    Adjust_Cursor_Position(form,pcVar3);
    wmove(form->w,form->currow,form->curcol);
    wclrtoeol(form->w);
    pcVar3 = Get_First_Whitespace_Character(pcVar4,iVar2 - (int)pcVar4);
    pcVar3 = Get_Start_Of_Data(pcVar3,iVar2 - (int)pcVar3);
    if ((pcVar3 != pcVar4) && (*pcVar3 != ' ')) {
      pWVar1 = form->w;
      pcVar4 = After_End_Of_Data(pcVar3,iVar2 - (int)pcVar3);
      waddnstr(pWVar1,pcVar3,(int)pcVar3 - (int)pcVar4);
    }
    form_local._4_4_ = 0;
  }
  return form_local._4_4_;
}

Assistant:

static int FE_Delete_Word(FORM * form)
{
  FIELD  *field = form->current;
  char   *bp = Address_Of_Current_Row_In_Buffer(form);
  char   *ep = bp + field->dcols;
  char   *cp = bp + form->curcol;
  char *s;
  
  Synchronize_Buffer(form);
  if (is_blank(*cp)) 
    return E_REQUEST_DENIED; /* not in word */

  /* move cursor to begin of word and erase to end of screen-line */
  Adjust_Cursor_Position(form,
                         After_Last_Whitespace_Character(bp,form->curcol)); 
  wmove(form->w,form->currow,form->curcol);
  wclrtoeol(form->w);

  /* skip over word in buffer */
  s = Get_First_Whitespace_Character(cp,(int)(ep-cp)); 
  /* to begin of next word    */
  s = Get_Start_Of_Data(s,(int)(ep - s));
  if ( (s!=cp) && !is_blank(*s))
    {
      /* copy remaining line to window */
      waddnstr(form->w,s,(int)(s - After_End_Of_Data(s,(int)(ep - s))));
    }
  return E_OK;
}